

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderOperatorCase::~ShaderOperatorCase(ShaderOperatorCase *this)

{
  ShaderOperatorCase *this_local;
  
  ~ShaderOperatorCase(this);
  operator_delete(this,0x1f8);
  return;
}

Assistant:

ShaderOperatorCase::~ShaderOperatorCase (void)
{
}